

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

ssize_t write(int __fd,void *__buf,size_t __n)

{
  __time_t _Var1;
  long lVar2;
  bool bVar3;
  rpchook_t *prVar4;
  int *piVar5;
  pollfd local_58;
  pollfd pf;
  ssize_t writeret;
  pollfd pStack_40;
  int timeout;
  size_t wrotelen;
  ssize_t ret;
  rpchook_t *lp;
  size_t nbyte_local;
  void *buf_local;
  pollfd pStack_10;
  int fd_local;
  
  if (g_sys_write_func == (write_pfn_t)0x0) {
    g_sys_write_func = (write_pfn_t)dlsym(0xffffffffffffffff,"write");
  }
  bVar3 = co_is_enable_sys_hook();
  if (bVar3) {
    prVar4 = get_by_fd(__fd);
    if ((prVar4 == (rpchook_t *)0x0) || ((prVar4->user_flag & 0x800U) != 0)) {
      pStack_10 = (pollfd)(*g_sys_write_func)(__fd,__buf,__n);
    }
    else {
      _Var1 = (prVar4->write_timeout).tv_sec;
      lVar2 = (prVar4->write_timeout).tv_usec;
      pf = (pollfd)(*g_sys_write_func)(__fd,__buf,__n);
      if (((long)pf < 0) &&
         ((piVar5 = __errno_location(), *piVar5 == 0xb ||
          (piVar5 = __errno_location(), *piVar5 == 0xb)))) {
        pf.fd = 0;
        pf.events = 0;
        pf.revents = 0;
      }
      if ((long)pf < 0) {
        pStack_10 = pf;
      }
      else {
        for (pStack_40 = pf; (ulong)pStack_40 < __n;
            pStack_40 = (pollfd)((long)pf + (long)pStack_40)) {
          memset(&local_58,0,8);
          local_58.events = 0x1c;
          local_58.fd = __fd;
          poll(&local_58,1,(int)_Var1 * 1000 + (int)(lVar2 / 1000));
          pf = (pollfd)(*g_sys_write_func)(__fd,(void *)((long)__buf + (long)pStack_40),
                                           __n - (long)pStack_40);
          if ((long)pf < 0) {
            piVar5 = __errno_location();
            if ((*piVar5 == 0xb) || (piVar5 = __errno_location(), *piVar5 == 0xb)) {
              piVar5 = __errno_location();
              *piVar5 = 0x7c5;
            }
            break;
          }
        }
        if (((long)pf < 1) && (pStack_40 == (pollfd)0x0)) {
          pStack_10 = pf;
        }
        else {
          pStack_10 = pStack_40;
        }
      }
    }
  }
  else {
    pStack_10 = (pollfd)(*g_sys_write_func)(__fd,__buf,__n);
  }
  return (ssize_t)pStack_10;
}

Assistant:

ssize_t write( int fd, const void *buf, size_t nbyte ) //special write which would return only on successfully writing entire data
{
	HOOK_SYS_FUNC( write );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_write_func( fd,buf,nbyte );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		ssize_t ret = g_sys_write_func( fd,buf,nbyte );
		return ret;
	}
	size_t wrotelen = 0;
	int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
				+ ( lp->write_timeout.tv_usec / 1000 );

	ssize_t writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
	if(writeret <0 && (errno == EAGAIN || errno == EWOULDBLOCK )){
		//retry with libco poll
		writeret = 0;
	}

	if(writeret<0){
		return writeret;
	}
	wrotelen+=writeret;

	while( wrotelen < nbyte ){//write data to socket as much as possible

		struct pollfd pf = { 0 };
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );
		//is writeable or poll timedout here
		writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
		if( writeret < 0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		wrotelen += writeret ;
	}
	if (writeret <= 0 && wrotelen == 0){
		return writeret;
	}
	return wrotelen;
}